

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content_chunked<httplib::Request>
               (Stream *strm,Request *x,ContentReceiverWithProgress *out)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int extraout_var;
  ulong uVar4;
  unsigned_long __args_1;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  char **ppcVar5;
  int extraout_var_04;
  ulong uVar6;
  char *__s1;
  ulong __args_2;
  long lVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  char *end_ptr;
  char buf [16];
  char byte;
  char *local_10f0;
  long local_10e8;
  ulong local_10e0;
  char *local_10d8;
  ulong local_10d0;
  char local_10c8;
  undefined7 uStack_10c7;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  code *local_10a8;
  code *pcStack_10a0;
  anon_class_8_1_54a39818 local_1090;
  ContentReceiverWithProgress *local_1088;
  char *local_1080;
  ulong local_1078;
  ulong local_1070;
  _Any_data local_1068;
  code *local_1058;
  char local_1048 [16];
  char local_1038 [4104];
  int extraout_var_00;
  
  local_10f0 = local_1048;
  local_10e8 = 0x10;
  lVar7 = 0;
  local_10e0 = 0;
  local_10d8 = &local_10c8;
  local_10d0 = 0;
  local_10c8 = '\0';
  local_1090.x = x;
  local_1088 = out;
  do {
    iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
    uVar4 = local_10e0;
    if (extraout_var < 0) {
      bVar8 = false;
      bVar10 = false;
    }
    else if (CONCAT44(extraout_var,iVar3) == 0) {
      bVar10 = lVar7 != 0;
      bVar8 = false;
    }
    else {
      if (local_10e0 < local_10e8 - 1U) {
        local_10e0 = local_10e0 + 1;
        local_10f0[uVar4] = local_1038[0];
        local_10f0[local_10e0] = '\0';
      }
      else {
        if (local_10d0 == 0) {
          if (local_10f0[local_10e0] != '\0') goto LAB_0015a444;
          std::__cxx11::string::_M_replace((ulong)&local_10d8,0,(char *)0x0,(ulong)local_10f0);
        }
        std::__cxx11::string::push_back((char)&local_10d8);
      }
      bVar8 = local_1038[0] != '\n';
      bVar10 = true;
    }
    lVar7 = lVar7 + -1;
  } while (bVar8);
  if (bVar10) {
    do {
      ppcVar5 = &local_10d8;
      if (local_10d0 == 0) {
        ppcVar5 = &local_10f0;
      }
      uVar4 = strtoul(*ppcVar5,&local_1080,0x10);
      ppcVar5 = &local_10d8;
      if (local_10d0 == 0) {
        ppcVar5 = &local_10f0;
      }
      cVar9 = '\x01';
      if ((local_1080 != *ppcVar5) && (uVar4 != 0xffffffffffffffff)) {
        if (uVar4 == 0) {
          cVar9 = '\x03';
        }
        else {
          local_10a8 = (code *)0x0;
          pcStack_10a0 = (code *)0x0;
          local_10b8 = 0;
          uStack_10b0 = 0;
          std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                    ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     &local_1068,local_1088);
          uVar6 = 0;
          do {
            __args_2 = uVar6;
            uVar6 = uVar4 - __args_2;
            if (uVar4 < __args_2 || uVar6 == 0) break;
            if (0xfff < uVar6) {
              uVar6 = 0x1000;
            }
            iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar6);
            __args_1 = CONCAT44(extraout_var_00,iVar3);
            if ((__args_1 == 0 || extraout_var_00 < 0) ||
               (bVar10 = std::
                         function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                         ::operator()((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
                                       *)&local_1068,local_1038,__args_1,__args_2,uVar4), !bVar10))
            {
              bVar10 = false;
              uVar6 = __args_2;
            }
            else {
              uVar6 = __args_1 + __args_2;
              if ((local_10a8 == (code *)0x0) ||
                 (local_1078 = uVar4, local_1070 = uVar6,
                 cVar2 = (*pcStack_10a0)(&local_10b8,&local_1070,&local_1078), cVar2 != '\0')) {
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (bVar10);
          if (local_1058 != (code *)0x0) {
            (*local_1058)(&local_1068,&local_1068,__destroy_functor);
          }
          if (local_10a8 != (code *)0x0) {
            (*local_10a8)(&local_10b8,&local_10b8,3);
          }
          if (uVar4 <= __args_2) {
            local_10e0 = 0;
            local_10d0 = 0;
            *local_10d8 = '\0';
            lVar7 = 0;
            do {
              iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
              uVar6 = local_10e0;
              if (extraout_var_01 < 0) {
                bVar8 = false;
                bVar10 = false;
              }
              else if (CONCAT44(extraout_var_01,iVar3) == 0) {
                bVar10 = lVar7 != 0;
                bVar8 = false;
              }
              else {
                if (local_10e0 < local_10e8 - 1U) {
                  local_10e0 = local_10e0 + 1;
                  local_10f0[uVar6] = local_1038[0];
                  local_10f0[local_10e0] = '\0';
                }
                else {
                  if (local_10d0 == 0) {
                    if (local_10f0[local_10e0] != '\0') goto LAB_0015a444;
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_10d8,0,(char *)0x0,(ulong)local_10f0);
                  }
                  std::__cxx11::string::push_back((char)&local_10d8);
                }
                bVar8 = local_1038[0] != '\n';
                bVar10 = true;
              }
              pcVar1 = local_10d8;
              lVar7 = lVar7 + -1;
            } while (bVar8);
            if (bVar10) {
              __s1 = local_10d8;
              if (local_10d0 == 0) {
                __s1 = local_10f0;
              }
              iVar3 = strcmp(__s1,"\r\n");
              if (iVar3 == 0) {
                local_10e0 = 0;
                local_10d0 = 0;
                *pcVar1 = '\0';
                lVar7 = 0;
                do {
                  iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
                  uVar6 = local_10e0;
                  if (extraout_var_02 < 0) {
                    cVar9 = true;
LAB_0015a193:
                    bVar10 = false;
                  }
                  else {
                    if (CONCAT44(extraout_var_02,iVar3) == 0) {
                      cVar9 = lVar7 == 0;
                      goto LAB_0015a193;
                    }
                    if (local_10e0 < local_10e8 - 1U) {
                      local_10e0 = local_10e0 + 1;
                      local_10f0[uVar6] = local_1038[0];
                      local_10f0[local_10e0] = '\0';
                    }
                    else {
                      if (local_10d0 == 0) {
                        if (local_10f0[local_10e0] != '\0') goto LAB_0015a444;
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_10d8,0,(char *)0x0,(ulong)local_10f0);
                      }
                      std::__cxx11::string::push_back((char)&local_10d8);
                    }
                    bVar10 = local_1038[0] != '\n';
                    cVar9 = false;
                  }
                  lVar7 = lVar7 + -1;
                } while (bVar10);
              }
            }
          }
        }
      }
    } while (cVar9 == '\0');
    if (cVar9 == '\x03') {
      if (uVar4 != 0) {
        __assert_fail("chunk_len == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                      ,0xe0c,
                      "bool httplib::detail::read_content_chunked(Stream &, T &, ContentReceiverWithProgress) [T = httplib::Request]"
                     );
      }
      lVar7 = 0;
      local_10e0 = 0;
      local_10d0 = 0;
      *local_10d8 = '\0';
      do {
        iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
        uVar4 = local_10e0;
        if (extraout_var_03 < 0) {
          bVar10 = false;
          bVar8 = false;
        }
        else if (CONCAT44(extraout_var_03,iVar3) == 0) {
          bVar8 = lVar7 != 0;
          bVar10 = false;
        }
        else {
          if (local_10e0 < local_10e8 - 1U) {
            local_10e0 = local_10e0 + 1;
            local_10f0[uVar4] = local_1038[0];
            local_10f0[local_10e0] = '\0';
          }
          else {
            if (local_10d0 == 0) {
              if (local_10f0[local_10e0] != '\0') {
LAB_0015a444:
                __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                              ,0x92f,"void httplib::detail::stream_line_reader::append(char)");
              }
              std::__cxx11::string::_M_replace((ulong)&local_10d8,0,(char *)0x0,(ulong)local_10f0);
            }
            std::__cxx11::string::push_back((char)&local_10d8);
          }
          bVar10 = local_1038[0] != '\n';
          bVar8 = true;
        }
        lVar7 = lVar7 + -1;
      } while (bVar10);
      if (bVar8) {
        do {
          uVar4 = local_10d0;
          ppcVar5 = &local_10d8;
          if (local_10d0 == 0) {
            ppcVar5 = &local_10f0;
          }
          pcVar1 = *ppcVar5;
          iVar3 = strcmp(pcVar1,"\r\n");
          bVar10 = iVar3 == 0;
          if (bVar10) break;
          if (uVar4 == 0) {
            uVar4 = local_10e0;
          }
          if (0x2000 < uVar4) break;
          parse_header<httplib::detail::read_content_chunked<httplib::Request>(httplib::Stream&,httplib::Request&,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                    (pcVar1,pcVar1 + (uVar4 - 2),local_1090);
          local_10e0 = 0;
          local_10d0 = 0;
          *local_10d8 = '\0';
          lVar7 = 0;
          do {
            iVar3 = (*strm->_vptr_Stream[4])(strm,local_1038,1);
            uVar4 = local_10e0;
            if (extraout_var_04 < 0) {
              bVar8 = false;
              bVar11 = false;
            }
            else if (CONCAT44(extraout_var_04,iVar3) == 0) {
              bVar11 = lVar7 != 0;
              bVar8 = false;
            }
            else {
              if (local_10e0 < local_10e8 - 1U) {
                local_10e0 = local_10e0 + 1;
                local_10f0[uVar4] = local_1038[0];
                local_10f0[local_10e0] = '\0';
              }
              else {
                if (local_10d0 == 0) {
                  if (local_10f0[local_10e0] != '\0') goto LAB_0015a444;
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_10d8,0,(char *)0x0,(ulong)local_10f0);
                }
                std::__cxx11::string::push_back((char)&local_10d8);
              }
              bVar8 = local_1038[0] != '\n';
              bVar11 = true;
            }
            lVar7 = lVar7 + -1;
          } while (bVar8);
        } while (bVar11);
        goto LAB_0015a414;
      }
    }
  }
  bVar10 = false;
LAB_0015a414:
  if (local_10d8 != &local_10c8) {
    operator_delete(local_10d8,CONCAT71(uStack_10c7,local_10c8) + 1);
  }
  return bVar10;
}

Assistant:

inline bool read_content_chunked(Stream &strm, T &x,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { return false; }

    if (!line_reader.getline()) { return false; }
  }

  assert(chunk_len == 0);

  // Trailer
  if (!line_reader.getline()) { return false; }

  while (strcmp(line_reader.ptr(), "\r\n")) {
    if (line_reader.size() > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }

    // Exclude line terminator
    constexpr auto line_terminator_len = 2;
    auto end = line_reader.ptr() + line_reader.size() - line_terminator_len;

    parse_header(line_reader.ptr(), end,
                 [&](std::string &&key, std::string &&val) {
                   x.headers.emplace(std::move(key), std::move(val));
                 });

    if (!line_reader.getline()) { return false; }
  }

  return true;
}